

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O0

void G_UnSnapshotLevel(bool hubLoad)

{
  bool bVar1;
  APlayerPawn *pAVar2;
  int local_314;
  APlayerPawn *pAStack_310;
  int i;
  APlayerPawn *next;
  APlayerPawn *pawn;
  TThinkerIterator<APlayerPawn> it;
  undefined1 local_2d8 [8];
  FArchive arc;
  bool hubLoad_local;
  
  if ((level.info)->snapshot != (FCompressedMemFile *)0x0) {
    arc._711_1_ = hubLoad;
    bVar1 = level_info_t::isValid(level.info);
    if (bVar1) {
      SaveVersion = (level.info)->snapshotVer;
      FCompressedMemFile::Reopen((level.info)->snapshot);
      FArchive::FArchive((FArchive *)local_2d8,(FFile *)(level.info)->snapshot);
      if ((arc._711_1_ & 1) != 0) {
        FArchive::SetHubTravel((FArchive *)local_2d8);
      }
      G_SerializeLevel((FArchive *)local_2d8,(bool)(arc._711_1_ & 1));
      FArchive::Close((FArchive *)local_2d8);
      level.FromSnapshot = true;
      TThinkerIterator<APlayerPawn>::TThinkerIterator((TThinkerIterator<APlayerPawn> *)&pawn,0x80);
      pAVar2 = TThinkerIterator<APlayerPawn>::Next((TThinkerIterator<APlayerPawn> *)&pawn);
      while (pAStack_310 = pAVar2, pAStack_310 != (APlayerPawn *)0x0) {
        pAVar2 = TThinkerIterator<APlayerPawn>::Next((TThinkerIterator<APlayerPawn> *)&pawn);
        if ((((pAStack_310->super_AActor).player == (player_t *)0x0) ||
            (((pAStack_310->super_AActor).player)->mo == (APlayerPawn *)0x0)) ||
           ((playeringame
             [(long)&(pAStack_310->super_AActor).player[-0x519b].ConversationNPC / 0x2a0] & 1U) == 0
           )) {
          local_314 = 0;
          while ((local_314 < 8 &&
                 ((((playeringame[local_314] & 1U) == 0 ||
                   (*(int *)(&DAT_00d635a0 + (long)local_314 * 0x2a0) == 0)) ||
                  (bVar1 = TObjPtr<AActor>::operator==
                                     ((TObjPtr<AActor> *)
                                      ((&players)[(long)local_314 * 0x54] + 0x248),
                                      &pAStack_310->super_AActor), !bVar1))))) {
            local_314 = local_314 + 1;
          }
          if (local_314 == 8) {
            (*(pAStack_310->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
          }
        }
      }
      FArchive::~FArchive((FArchive *)local_2d8);
    }
    level_info_t::ClearSnapshot(level.info);
    if ((arc._711_1_ & 1) != 0) {
      FBehavior::StaticUnlockLevelVarStrings();
    }
  }
  return;
}

Assistant:

void G_UnSnapshotLevel (bool hubLoad)
{
	if (level.info->snapshot == NULL)
		return;

	if (level.info->isValid())
	{
		SaveVersion = level.info->snapshotVer;
		level.info->snapshot->Reopen ();
		FArchive arc (*level.info->snapshot);
		if (hubLoad)
			arc.SetHubTravel ();
		G_SerializeLevel (arc, hubLoad);
		arc.Close ();
		level.FromSnapshot = true;

		TThinkerIterator<APlayerPawn> it;
		APlayerPawn *pawn, *next;

		next = it.Next();
		while ((pawn = next) != 0)
		{
			next = it.Next();
			if (pawn->player == NULL || pawn->player->mo == NULL || !playeringame[pawn->player - players])
			{
				int i;

				// If this isn't the unmorphed original copy of a player, destroy it, because it's extra.
				for (i = 0; i < MAXPLAYERS; ++i)
				{
					if (playeringame[i] && players[i].morphTics && players[i].mo->tracer == pawn)
					{
						break;
					}
				}
				if (i == MAXPLAYERS)
				{
					pawn->Destroy ();
				}
			}
		}
	}
	// No reason to keep the snapshot around once the level's been entered.
	level.info->ClearSnapshot();
	if (hubLoad)
	{
		// Unlock ACS global strings that were locked when the snapshot was made.
		FBehavior::StaticUnlockLevelVarStrings();
	}
}